

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPathMatcher.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XPathMatcher::startElement
          (XPathMatcher *this,XMLElementDecl *elemDecl,uint urlId,XMLCh *elemPrefix,
          RefVectorOf<xercesc_4_0::XMLAttr> *attrList,XMLSize_t attrCount,
          ValidationContext *validationContext)

{
  _func_int **pp_Var1;
  unsigned_long uVar2;
  XercesNodeTest *pXVar3;
  ulong getAt;
  bool bVar4;
  int iVar5;
  int iVar6;
  ValueStackOf<unsigned_long> *pVVar7;
  XercesLocationPath *pXVar8;
  XercesStep *pXVar9;
  XMLSize_t *pXVar10;
  XMLAttr *pXVar11;
  SchemaAttDef *pSVar12;
  undefined4 extraout_var;
  XMLCh *toDelete;
  undefined4 extraout_var_01;
  byte bVar13;
  XMLSize_t XVar14;
  ulong getAt_00;
  XPathMatcher *pXVar15;
  DatatypeValidator *pDVar16;
  ulong uVar17;
  XMLCh *toSearch;
  XMLSize_t XVar18;
  XMLSize_t getAt_01;
  QName elemQName;
  ArrayJanitor<char16_t> janPrefix;
  undefined1 local_a8 [24];
  bool local_90;
  MemoryManager *local_88;
  RefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_> *local_80;
  RefVectorOf<xercesc_4_0::XercesLocationPath> *pRStack_78;
  SchemaElementDecl *local_60;
  XMLSize_t local_58;
  XMLCh *local_50;
  XPathMatcher *local_48;
  ArrayJanitor<char16_t> local_40;
  undefined4 extraout_var_00;
  
  if (this->fLocationPathSize != 0) {
    getAt_01 = 0;
    local_60 = (SchemaElementDecl *)elemDecl;
    local_58 = attrCount;
    local_50 = elemPrefix;
    local_48 = (XPathMatcher *)attrList;
    do {
      uVar2 = this->fCurrentStep[getAt_01];
      pVVar7 = BaseRefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_>::elementAt
                         (&this->fStepIndexes->
                           super_BaseRefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_>,getAt_01
                         );
      ValueVectorOf<unsigned_long>::ensureExtraCapacity(&pVVar7->fVector,1);
      XVar18 = (pVVar7->fVector).fCurCount;
      (pVVar7->fVector).fCurCount = XVar18 + 1;
      (pVVar7->fVector).fElemList[XVar18] = uVar2;
      bVar13 = this->fMatched[getAt_01] & 5;
      XVar18 = this->fNoMatchDepth[getAt_01];
      if (bVar13 == 1 || XVar18 != 0) {
        this->fNoMatchDepth[getAt_01] = XVar18 + 1;
      }
      else {
        if (bVar13 == 5) {
          this->fMatched[getAt_01] = '\r';
        }
        pXVar8 = BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::elementAt
                           (&this->fLocationPaths->
                             super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>,getAt_01);
        if (pXVar8->fSteps == (RefVectorOf<xercesc_4_0::XercesStep> *)0x0) {
          pXVar10 = this->fCurrentStep;
          uVar17 = 0;
LAB_003116ac:
          XVar18 = pXVar10[getAt_01];
        }
        else {
          uVar17 = (pXVar8->fSteps->super_BaseRefVectorOf<xercesc_4_0::XercesStep>).fCurCount;
          pXVar10 = this->fCurrentStep;
          XVar18 = pXVar10[getAt_01];
          while (XVar18 < uVar17) {
            pXVar9 = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt
                               (&pXVar8->fSteps->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,
                                XVar18);
            pXVar10 = this->fCurrentStep;
            if (pXVar9->fAxisType != 3) goto LAB_003116ac;
            XVar18 = pXVar10[getAt_01] + 1;
            pXVar10[getAt_01] = XVar18;
          }
        }
        getAt_00 = XVar18;
        if (XVar18 == uVar17) {
LAB_003116b5:
          this->fMatched[getAt_01] = '\x01';
        }
        else {
          while (getAt_00 < uVar17) {
            pXVar9 = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt
                               (&pXVar8->fSteps->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,
                                getAt_00);
            pXVar10 = this->fCurrentStep;
            getAt_00 = pXVar10[getAt_01];
            if (pXVar9->fAxisType != 4) break;
            pXVar10[getAt_01] = getAt_00 + 1;
            getAt_00 = getAt_00 + 1;
          }
          if (getAt_00 == uVar17) {
LAB_003116f7:
            this->fNoMatchDepth[getAt_01] = this->fNoMatchDepth[getAt_01] + 1;
          }
          else {
            if (getAt_00 == uVar2 || XVar18 < getAt_00) {
              pXVar9 = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt
                                 (&pXVar8->fSteps->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,
                                  getAt_00);
              pXVar10 = this->fCurrentStep;
              if (pXVar9->fAxisType == 1) {
                pXVar9 = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt
                                   (&pXVar8->fSteps->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,
                                    pXVar10[getAt_01]);
                pXVar3 = pXVar9->fNodeTest;
                pXVar15 = (XPathMatcher *)local_a8;
                QName::QName((QName *)pXVar15,local_50,
                             ((local_60->super_XMLElementDecl).fElementName)->fLocalPart,urlId,
                             this->fMemoryManager);
                bVar4 = matches(pXVar15,pXVar3,(QName *)local_a8);
                pXVar10 = this->fCurrentStep;
                if (!bVar4) {
                  if (XVar18 < pXVar10[getAt_01]) {
                    pXVar10[getAt_01] = XVar18;
                  }
                  else {
                    this->fNoMatchDepth[getAt_01] = this->fNoMatchDepth[getAt_01] + 1;
                  }
                  QName::~QName((QName *)local_a8);
                  goto LAB_003116ff;
                }
                pXVar10[getAt_01] = pXVar10[getAt_01] + 1;
                QName::~QName((QName *)local_a8);
                pXVar10 = this->fCurrentStep;
              }
            }
            getAt = pXVar10[getAt_01];
            if (getAt == uVar17) {
              if (getAt_00 <= XVar18) goto LAB_003116b5;
              pXVar10[getAt_01] = XVar18;
              this->fMatched[getAt_01] = '\x05';
            }
            else if ((getAt < uVar17) &&
                    (pXVar9 = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt
                                        (&pXVar8->fSteps->
                                          super_BaseRefVectorOf<xercesc_4_0::XercesStep>,getAt),
                    pXVar9->fAxisType == 2)) {
              if (local_58 != 0) {
                pXVar9 = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt
                                   (&pXVar8->fSteps->super_BaseRefVectorOf<xercesc_4_0::XercesStep>,
                                    this->fCurrentStep[getAt_01]);
                pXVar3 = pXVar9->fNodeTest;
                XVar14 = 0;
                do {
                  pXVar15 = local_48;
                  pXVar11 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                                      ((BaseRefVectorOf<xercesc_4_0::XMLAttr> *)local_48,XVar14);
                  bVar4 = matches(pXVar15,pXVar3,pXVar11->fAttName);
                  if (bVar4) {
                    XVar14 = this->fCurrentStep[getAt_01] + 1;
                    this->fCurrentStep[getAt_01] = XVar14;
                    if (XVar14 != uVar17) break;
                    this->fMatched[getAt_01] = '\x03';
                    pSVar12 = SchemaElementDecl::getAttDef
                                        (local_60,pXVar11->fAttName->fLocalPart,
                                         pXVar11->fAttName->fURIId);
                    if (pSVar12 == (SchemaAttDef *)0x0) {
                      toSearch = pXVar11->fValue;
LAB_00311a5e:
                      pDVar16 = (DatatypeValidator *)0x0;
                    }
                    else {
                      pDVar16 = pSVar12->fDatatypeValidator;
                      toSearch = pXVar11->fValue;
                      if (pDVar16 == (DatatypeValidator *)0x0) goto LAB_00311a5e;
                      if ((pDVar16->fType == QName) &&
                         (iVar5 = XMLString::indexOf(toSearch,L':'), iVar5 != -1)) {
                        local_88 = this->fMemoryManager;
                        local_a8._0_8_ = (_func_int **)0x0;
                        local_a8._8_8_ = (_func_int **)0x3ff;
                        local_a8._16_8_ = (uchar *)0x0;
                        local_90 = false;
                        local_80 = (RefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_> *)0x0;
                        pRStack_78 = (RefVectorOf<xercesc_4_0::XercesLocationPath> *)0x0;
                        iVar6 = (*local_88->_vptr_MemoryManager[3])(local_88,0x800);
                        pRStack_78 = (RefVectorOf<xercesc_4_0::XercesLocationPath> *)
                                     CONCAT44(extraout_var,iVar6);
                        *(undefined2 *)
                         &(pRStack_78->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>).
                          _vptr_BaseRefVectorOf = 0;
                        if (local_a8._0_8_ == local_a8._8_8_) {
                          XMLBuffer::ensureCapacity((XMLBuffer *)local_a8,1);
                        }
                        pp_Var1 = (_func_int **)(local_a8._0_8_ + 1);
                        *(undefined2 *)
                         ((long)&(pRStack_78->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>
                                 )._vptr_BaseRefVectorOf + local_a8._0_8_ * 2) = 0x7b;
                        XVar14 = (XMLSize_t)iVar5;
                        local_a8._0_8_ = pp_Var1;
                        if (validationContext != (ValidationContext *)0x0) {
                          iVar5 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                                            (this->fMemoryManager,XVar14 * 2 + 2);
                          toDelete = (XMLCh *)CONCAT44(extraout_var_00,iVar5);
                          ArrayJanitor<char16_t>::ArrayJanitor
                                    (&local_40,toDelete,this->fMemoryManager);
                          XMLString::subString(toDelete,toSearch,0,XVar14,this->fMemoryManager);
                          iVar5 = (*validationContext->_vptr_ValidationContext[0xf])
                                            (validationContext,toDelete);
                          XMLBuffer::append((XMLBuffer *)local_a8,
                                            (XMLCh *)CONCAT44(extraout_var_01,iVar5));
                          ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
                        }
                        if (local_a8._0_8_ == local_a8._8_8_) {
                          XMLBuffer::ensureCapacity((XMLBuffer *)local_a8,1);
                        }
                        *(undefined2 *)
                         ((long)&(pRStack_78->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>
                                 )._vptr_BaseRefVectorOf + local_a8._0_8_ * 2) = 0x7d;
                        local_a8._0_8_ = (_func_int **)(local_a8._0_8_ + 1);
                        XMLBuffer::append((XMLBuffer *)local_a8,toSearch + XVar14 + 1);
                        *(undefined2 *)
                         ((long)&(pRStack_78->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>
                                 )._vptr_BaseRefVectorOf + local_a8._0_8_ * 2) = 0;
                        (*this->_vptr_XPathMatcher[6])(this,pRStack_78,pDVar16,0);
                        (*local_88->_vptr_MemoryManager[4])(local_88,pRStack_78);
                        break;
                      }
                    }
                    (*this->_vptr_XPathMatcher[6])(this,toSearch,pDVar16,0);
                    break;
                  }
                  XVar14 = XVar14 + 1;
                } while (local_58 != XVar14);
              }
              if ((this->fMatched[getAt_01] & 1) == 0) {
                if (this->fCurrentStep[getAt_01] <= XVar18) goto LAB_003116f7;
                this->fCurrentStep[getAt_01] = XVar18;
              }
            }
          }
        }
      }
LAB_003116ff:
      getAt_01 = getAt_01 + 1;
    } while (getAt_01 < this->fLocationPathSize);
  }
  return;
}

Assistant:

void XPathMatcher::startElement(const XMLElementDecl& elemDecl,
                                const unsigned int urlId,
                                const XMLCh* const elemPrefix,
								const RefVectorOf<XMLAttr>& attrList,
                                const XMLSize_t attrCount,
                                ValidationContext* validationContext /*=0*/) {

    for (XMLSize_t i = 0; i < fLocationPathSize; i++) {

        // push context
        XMLSize_t startStep = fCurrentStep[i];
        fStepIndexes->elementAt(i)->push(startStep);

        // try next xpath, if not matching
        if ((fMatched[i] & XP_MATCHED_D) == XP_MATCHED || fNoMatchDepth[i] > 0) {
            fNoMatchDepth[i]++;
            continue;
        }

        if((fMatched[i] & XP_MATCHED_D) == XP_MATCHED_D) {
            fMatched[i] = XP_MATCHED_DP;
        }

        // consume self::node() steps
        XercesLocationPath* locPath = fLocationPaths->elementAt(i);
        XMLSize_t stepSize = locPath->getStepSize();

        while (fCurrentStep[i] < stepSize &&
               locPath->getStep(fCurrentStep[i])->getAxisType() == XercesStep::AxisType_SELF) {
            fCurrentStep[i]++;
        }

        if (fCurrentStep[i] == stepSize) {

            fMatched[i] = XP_MATCHED;
            continue;
        }

        // now if the current step is a descendant step, we let the next
        // step do its thing; if it fails, we reset ourselves
        // to look at this step for next time we're called.
        // so first consume all descendants:
        XMLSize_t descendantStep = fCurrentStep[i];

        while (fCurrentStep[i] < stepSize &&
               locPath->getStep(fCurrentStep[i])->getAxisType() == XercesStep::AxisType_DESCENDANT) {
            fCurrentStep[i]++;
        }

        bool sawDescendant = fCurrentStep[i] > descendantStep;
        if (fCurrentStep[i] == stepSize) {

            fNoMatchDepth[i]++;
            continue;
        }

        // match child::... step, if haven't consumed any self::node()
        if ((fCurrentStep[i] == startStep || fCurrentStep[i] > descendantStep) &&
            locPath->getStep(fCurrentStep[i])->getAxisType() == XercesStep::AxisType_CHILD) {

            XercesStep* step = locPath->getStep(fCurrentStep[i]);
            XercesNodeTest* nodeTest = step->getNodeTest();

            QName elemQName(elemPrefix, elemDecl.getElementName()->getLocalPart(), urlId, fMemoryManager);
            if (!matches(nodeTest, &elemQName)) {

                if(fCurrentStep[i] > descendantStep) {
                    fCurrentStep[i] = descendantStep;
                    continue;
                }

                fNoMatchDepth[i]++;
                continue;
            }

            fCurrentStep[i]++;
        }

        if (fCurrentStep[i] == stepSize) {

            if (sawDescendant) {

                fCurrentStep[i] = descendantStep;
                fMatched[i] = XP_MATCHED_D;
            }
            else {
                fMatched[i] = XP_MATCHED;
            }

            continue;
        }

        // match attribute::... step
        if (fCurrentStep[i] < stepSize &&
            locPath->getStep(fCurrentStep[i])->getAxisType() == XercesStep::AxisType_ATTRIBUTE) {

            if (attrCount) {

                XercesNodeTest* nodeTest = locPath->getStep(fCurrentStep[i])->getNodeTest();

                for (XMLSize_t attrIndex = 0; attrIndex < attrCount; attrIndex++) {

                    const XMLAttr* curDef = attrList.elementAt(attrIndex);

                    if (matches(nodeTest, curDef->getAttName())) {

                        fCurrentStep[i]++;

                        if (fCurrentStep[i] == stepSize) {

                            fMatched[i] = XP_MATCHED_A;

                            SchemaAttDef* attDef = ((SchemaElementDecl&) elemDecl).getAttDef(curDef->getName(), curDef->getURIId());
                            DatatypeValidator* dv = (attDef) ? attDef->getDatatypeValidator() : 0;
                            const XMLCh* value = curDef->getValue();
                            // store QName using their Clark name
                            if(dv && dv->getType()==DatatypeValidator::QName)
                            {
                                int index=XMLString::indexOf(value, chColon);
                                if(index==-1)
                                    matched(value, dv, false);
                                else
                                {
                                    XMLBuffer buff(1023, fMemoryManager);
                                    buff.append(chOpenCurly);
                                    if(validationContext)
                                    {
                                        XMLCh* prefix=(XMLCh*)fMemoryManager->allocate((index+1)*sizeof(XMLCh));
                                        ArrayJanitor<XMLCh> janPrefix(prefix, fMemoryManager);
                                        XMLString::subString(prefix, value, 0, (XMLSize_t)index, fMemoryManager);
                                        buff.append(validationContext->getURIForPrefix(prefix));
                                    }
                                    buff.append(chCloseCurly);
                                    buff.append(value+index+1);
                                    matched(buff.getRawBuffer(), dv, false);
                                }
                            }
                            else
                                matched(value, dv, false);
                        }
                        break;
                    }
                }
            }

            if ((fMatched[i] & XP_MATCHED) != XP_MATCHED) {

                if(fCurrentStep[i] > descendantStep) {

                    fCurrentStep[i] = descendantStep;
                    continue;
                }

                fNoMatchDepth[i]++;
            }
        }
    }
}